

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O3

int ARKodeSetUserData(void *arkode_mem,void *user_data)

{
  int iVar1;
  
  if (arkode_mem == (void *)0x0) {
    iVar1 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,0x357,"ARKodeSetUserData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"arkode_mem = NULL illegal.");
  }
  else {
    *(void **)((long)arkode_mem + 0x10) = user_data;
    if (*(int *)((long)arkode_mem + 0x54) != 0) {
      *(void **)((long)arkode_mem + 0x60) = user_data;
    }
    if (*(int *)((long)arkode_mem + 0x68) != 0) {
      *(void **)((long)arkode_mem + 0x78) = user_data;
    }
    if (*(long *)((long)arkode_mem + 0x3a0) != 0) {
      *(void **)(*(long *)((long)arkode_mem + 0x3a0) + 0x80) = user_data;
    }
    if (*(long *)((long)arkode_mem + 0x3b8) != 0) {
      *(void **)((long)arkode_mem + 0x3c0) = user_data;
    }
    if (*(code **)((long)arkode_mem + 0xa8) != (code *)0x0) {
      iVar1 = (**(code **)((long)arkode_mem + 0xa8))();
      return iVar1;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int ARKodeSetUserData(void* arkode_mem, void* user_data)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem            = (ARKodeMem)arkode_mem;
  ark_mem->user_data = user_data;

  /* Set data for efun */
  if (ark_mem->user_efun) { ark_mem->e_data = user_data; }

  /* Set data for rfun */
  if (ark_mem->user_rfun) { ark_mem->r_data = user_data; }

  /* Set data for root finding */
  if (ark_mem->root_mem != NULL) { ark_mem->root_mem->root_data = user_data; }

  /* Set data for post-processing a step */
  if (ark_mem->ProcessStep != NULL) { ark_mem->ps_data = user_data; }

  /* Set user data into stepper (if provided) */
  if (ark_mem->step_setuserdata)
  {
    return (ark_mem->step_setuserdata(arkode_mem, user_data));
  }

  return (ARK_SUCCESS);
}